

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZSkylineNSymStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>::TPZSkylineNSymStructMatrix
          (TPZSkylineNSymStructMatrix<double,_TPZStructMatrixTBBFlow<double>_> *this,
          TPZAutoPointer<TPZCompMesh> *cmesh)

{
  TPZAutoPointer<TPZCompMesh> local_10;
  
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xf0 =
       0x17ed220;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x17ed2e8;
  *(undefined4 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xf8 = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xfc = 1;
  local_10 = (TPZAutoPointer<TPZCompMesh>)cmesh->fRef;
  LOCK();
  ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>::TPZStructMatrix
            (&this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>,
             &PTR_construction_vtable_104__017eb6b0,&local_10);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&local_10);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xf0 =
       0x17eb638;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x17eb478;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x17eb540;
  return;
}

Assistant:

TPZSkylineNSymStructMatrix<TVar,TPar>::TPZSkylineNSymStructMatrix(TPZAutoPointer<TPZCompMesh> cmesh)
  : TPZSkylineStructMatrix<TVar,TPar>(cmesh)
{
  ///nothing here
}